

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O2

void VP8SetSegmentParams(VP8Encoder *enc,float quality)

{
  byte bVar1;
  VP8SegmentInfo *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  VP8Matrix *m;
  VP8SegmentInfo *pVVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  byte local_48 [4];
  undefined4 uStack_44;
  undefined8 uStack_40;
  VP8SegmentInfo *local_38;
  
  uVar14 = (enc->segment_hdr_).num_segments_;
  lVar19 = (long)(int)uVar14;
  iVar5 = enc->config_->sns_strength;
  dVar22 = (double)quality / 100.0;
  if (enc->config_->emulate_jpeg_size == 0) {
    dVar22 = (double)(~-(ulong)(dVar22 < 0.75) & (ulong)(dVar22 + dVar22 + -1.0) |
                     (ulong)(dVar22 * 0.6666666666666666) & -(ulong)(dVar22 < 0.75));
    dVar23 = 0.3333333333333333;
  }
  else {
    dVar23 = (double)enc->alpha_ / 255.0;
    if (dVar23 <= 0.85) {
      dVar23 = (double)(~-(ulong)(dVar23 < 0.3) &
                        (ulong)((dVar23 + -0.3) * -0.9090909090909091 + 0.9) |
                       -(ulong)(dVar23 < 0.3) & 0x3feccccccccccccd);
    }
    else {
      dVar23 = 0.4;
    }
  }
  dVar22 = pow(dVar22,dVar23);
  local_38 = enc->dqm_;
  uVar7 = 0;
  if (0 < (int)uVar14) {
    uVar7 = (ulong)uVar14;
  }
  for (lVar18 = 0; uVar7 * 0x2e8 - lVar18 != 0; lVar18 = lVar18 + 0x2e8) {
    dVar23 = pow(dVar22,(double)*(int *)((long)&enc->dqm_[0].alpha_ + lVar18) *
                        (((double)iVar5 * 0.9) / 100.0) * -0.0078125 + 1.0);
    iVar3 = (int)((1.0 - dVar23) * 127.0);
    if (0x7e < iVar3) {
      iVar3 = 0x7f;
    }
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    *(int *)((long)&enc->dqm_[0].quant_ + lVar18) = iVar3;
  }
  iVar5 = enc->dqm_[0].quant_;
  enc->base_quant_ = iVar5;
  piVar9 = &enc->dqm_[lVar19].quant_;
  for (; lVar19 < 4; lVar19 = lVar19 + 1) {
    *piVar9 = iVar5;
    piVar9 = piVar9 + 0xba;
  }
  iVar5 = enc->config_->sns_strength;
  iVar4 = (((enc->uv_alpha_ * 10 + -0x280) / 0x46) * iVar5) / 100;
  iVar3 = 6;
  if (iVar4 < 6) {
    iVar3 = iVar4;
  }
  iVar4 = -4;
  if (-4 < iVar3) {
    iVar4 = iVar3;
  }
  iVar5 = iVar5 / -0x19;
  iVar3 = 0xf;
  if (iVar5 < 0xf) {
    iVar3 = iVar5;
  }
  iVar5 = -0xf;
  if (-0xf < iVar3) {
    iVar5 = iVar3;
  }
  enc->dq_y1_dc_ = 0;
  enc->dq_y2_dc_ = 0;
  enc->dq_y2_ac_ = 0;
  enc->dq_uv_dc_ = iVar5;
  enc->dq_uv_ac_ = iVar4;
  iVar5 = enc->config_->filter_strength;
  for (lVar19 = 0x50c; pVVar2 = local_38, lVar19 != 0x10ac; lVar19 = lVar19 + 0x2e8) {
    uVar8 = *(uint *)((long)enc->parts_ + lVar19 + -0x74);
    if (0x7e < (int)uVar8) {
      uVar8 = 0x7f;
    }
    uVar7 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar7 = 0;
    }
    iVar3 = VP8FilterStrengthFromDelta((enc->filter_hdr_).sharpness_,(uint)(kAcTable[uVar7] >> 2));
    iVar4 = (iVar3 * iVar5 * 5) / (*(int *)((long)enc->parts_ + lVar19 + -0x78) + 0x100);
    iVar3 = 0x3f;
    if (iVar4 < 0x3f) {
      iVar3 = iVar4;
    }
    if (iVar4 < 2) {
      iVar3 = 0;
    }
    *(int *)((long)enc->parts_ + lVar19 + -0x70) = iVar3;
  }
  (enc->filter_hdr_).level_ = enc->dqm_[0].fstrength_;
  (enc->filter_hdr_).simple_ = (uint)(enc->config_->filter_type == 0);
  (enc->filter_hdr_).sharpness_ = enc->config_->filter_sharpness;
  if (1 < (int)uVar14) {
    _local_48 = 0x100000000;
    uStack_40 = 0x300000002;
    iVar5 = (enc->segment_hdr_).num_segments_;
    iVar3 = 4;
    if (iVar5 < 4) {
      iVar3 = iVar5;
    }
    uVar14 = 1;
    uVar7 = 1;
    while( true ) {
      lVar19 = (long)(int)uVar14;
      if ((long)iVar3 <= (long)uVar7) break;
      pVVar20 = pVVar2 + uVar7;
      uVar10 = 0;
      if (0 < (int)uVar14) {
        uVar10 = (ulong)uVar14;
      }
      piVar9 = &enc->dqm_[0].fstrength_;
      for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
        if ((pVVar20->quant_ == piVar9[-1]) && (pVVar20->fstrength_ == *piVar9)) {
          *(int *)(local_48 + uVar7 * 4) = (int)uVar13;
          goto LAB_0012a8bf;
        }
        piVar9 = piVar9 + 0xba;
      }
      *(int *)(local_48 + uVar7 * 4) = (int)uVar10;
      if (uVar7 != uVar14) {
        memcpy(pVVar2 + lVar19,pVVar20,0x2e8);
      }
      uVar14 = uVar14 + 1;
LAB_0012a8bf:
      uVar7 = uVar7 + 1;
    }
    if ((int)uVar14 < iVar3) {
      for (uVar7 = (ulong)(uint)(enc->mb_h_ * enc->mb_w_); 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        bVar1 = *(byte *)(enc->mb_info_ + (uVar7 - 1));
        *(byte *)(enc->mb_info_ + (uVar7 - 1)) =
             bVar1 & 0x9f | (local_48[bVar1 >> 3 & 0xc] & 3) << 5;
      }
      (enc->segment_hdr_).num_segments_ = uVar14;
      pVVar20 = enc->dqm_ + lVar19;
      lVar19 = iVar3 - lVar19;
      while (bVar21 = lVar19 != 0, lVar19 = lVar19 + -1, bVar21) {
        memcpy(pVVar20,pVVar2 + (int)(uVar14 - 1),0x2e8);
        pVVar20 = pVVar20 + 1;
      }
    }
  }
  iVar5 = 0;
  if (3 < enc->method_) {
    iVar5 = enc->config_->sns_strength;
  }
  uVar14 = (enc->segment_hdr_).num_segments_;
  if ((int)uVar14 < 1) {
    uVar14 = 0;
  }
  uVar7 = (ulong)uVar14;
  m = &enc->dqm_[0].y2_;
  while (bVar21 = uVar7 != 0, uVar7 = uVar7 - 1, bVar21) {
    uVar14 = *(uint *)(m[2].q_ + 4);
    uVar8 = enc->dq_y1_dc_ + uVar14;
    if (0x7e < (int)uVar8) {
      uVar8 = 0x7f;
    }
    uVar10 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar10 = 0;
    }
    uVar11 = 0x7f;
    uVar8 = uVar11;
    if ((int)uVar14 < 0x7f) {
      uVar8 = uVar14;
    }
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    m[-1].q_[0] = (ushort)kDcTable[uVar10];
    m[-1].q_[1] = kAcTable[uVar8];
    uVar8 = enc->dq_y2_dc_ + uVar14;
    if (0x7e < (int)uVar8) {
      uVar8 = uVar11;
    }
    uVar17 = 0;
    uVar10 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar10 = 0;
    }
    m->q_[0] = (ushort)kDcTable[uVar10] * 2;
    uVar8 = enc->dq_y2_ac_ + uVar14;
    if (0x7e < (int)uVar8) {
      uVar8 = uVar11;
    }
    if ((int)uVar8 < 1) {
      uVar8 = uVar17;
    }
    m->q_[1] = kAcTable2[uVar8];
    uVar8 = enc->dq_uv_dc_ + uVar14;
    if (0x74 < (int)uVar8) {
      uVar8 = 0x75;
    }
    if ((int)uVar8 < 1) {
      uVar8 = uVar17;
    }
    m[1].q_[0] = (ushort)kDcTable[uVar8];
    uVar14 = uVar14 + enc->dq_uv_ac_;
    if (0x7e < (int)uVar14) {
      uVar14 = uVar11;
    }
    if ((int)uVar14 < 1) {
      uVar14 = uVar17;
    }
    m[1].q_[1] = kAcTable[uVar14];
    iVar4 = ExpandMatrix(m + -1,0);
    iVar3 = ExpandMatrix(m,1);
    iVar6 = ExpandMatrix(m + 1,2);
    uVar14 = iVar4 * iVar4;
    iVar16 = (int)(uVar14 * 3) >> 7;
    *(int *)(m[2].q_ + 0xe) = iVar16;
    uVar8 = iVar3 * iVar3;
    *(uint *)(m[2].q_ + 0xc) = uVar8 * 3;
    iVar15 = iVar6 * iVar6 * 3 >> 6;
    *(int *)m[2].iq_ = iVar15;
    *(uint *)(m[2].iq_ + 2) = uVar14 >> 7;
    iVar12 = (int)(uVar14 * 7) >> 3;
    *(int *)(m[2].iq_ + 10) = iVar12;
    *(uint *)(m[2].iq_ + 8) = uVar8 >> 2;
    iVar3 = iVar6 * iVar6 * 2;
    *(int *)(m[2].iq_ + 0xc) = iVar3;
    iVar4 = iVar4 * iVar5 >> 5;
    *(int *)(m[2].iq_ + 6) = iVar4;
    if (iVar16 < 1) {
      m[2].q_[0xe] = 1;
      m[2].q_[0xf] = 0;
    }
    if ((int)(uVar8 * 3) < 1) {
      m[2].q_[0xc] = 1;
      m[2].q_[0xd] = 0;
    }
    if (iVar15 < 1) {
      m[2].iq_[0] = 1;
      m[2].iq_[1] = 0;
    }
    if (uVar14 < 0x80) {
      m[2].iq_[2] = 1;
      m[2].iq_[3] = 0;
    }
    if (iVar12 < 1) {
      m[2].iq_[10] = 1;
      m[2].iq_[0xb] = 0;
    }
    if (uVar8 < 4) {
      m[2].iq_[8] = 1;
      m[2].iq_[9] = 0;
    }
    if (iVar3 < 1) {
      m[2].iq_[0xc] = 1;
      m[2].iq_[0xd] = 0;
    }
    if (iVar4 < 1) {
      m[2].iq_[6] = 1;
      m[2].iq_[7] = 0;
    }
    *(uint *)(m[2].q_ + 10) = (uint)m[-1].q_[0] * 0x14;
    m[2].q_[8] = 0;
    m[2].q_[9] = 0;
    *(long *)m[2].bias_ = (long)(int)(uVar14 * 1000);
    m = (VP8Matrix *)(m[3].bias_ + 2);
  }
  return;
}

Assistant:

void VP8SetSegmentParams(VP8Encoder* const enc, float quality) {
  int i;
  int dq_uv_ac, dq_uv_dc;
  const int num_segments = enc->segment_hdr_.num_segments_;
  const double amp = SNS_TO_DQ * enc->config_->sns_strength / 100. / 128.;
  const double Q = quality / 100.;
  const double c_base = enc->config_->emulate_jpeg_size ?
      QualityToJPEGCompression(Q, enc->alpha_ / 255.) :
      QualityToCompression(Q);
  for (i = 0; i < num_segments; ++i) {
    // We modulate the base coefficient to accommodate for the quantization
    // susceptibility and allow denser segments to be quantized more.
    const double expn = 1. - amp * enc->dqm_[i].alpha_;
    const double c = pow(c_base, expn);
    const int q = (int)(127. * (1. - c));
    assert(expn > 0.);
    enc->dqm_[i].quant_ = clip(q, 0, 127);
  }

  // purely indicative in the bitstream (except for the 1-segment case)
  enc->base_quant_ = enc->dqm_[0].quant_;

  // fill-in values for the unused segments (required by the syntax)
  for (i = num_segments; i < NUM_MB_SEGMENTS; ++i) {
    enc->dqm_[i].quant_ = enc->base_quant_;
  }

  // uv_alpha_ is normally spread around ~60. The useful range is
  // typically ~30 (quite bad) to ~100 (ok to decimate UV more).
  // We map it to the safe maximal range of MAX/MIN_DQ_UV for dq_uv.
  dq_uv_ac = (enc->uv_alpha_ - MID_ALPHA) * (MAX_DQ_UV - MIN_DQ_UV)
                                          / (MAX_ALPHA - MIN_ALPHA);
  // we rescale by the user-defined strength of adaptation
  dq_uv_ac = dq_uv_ac * enc->config_->sns_strength / 100;
  // and make it safe.
  dq_uv_ac = clip(dq_uv_ac, MIN_DQ_UV, MAX_DQ_UV);
  // We also boost the dc-uv-quant a little, based on sns-strength, since
  // U/V channels are quite more reactive to high quants (flat DC-blocks
  // tend to appear, and are unpleasant).
  dq_uv_dc = -4 * enc->config_->sns_strength / 100;
  dq_uv_dc = clip(dq_uv_dc, -15, 15);   // 4bit-signed max allowed

  enc->dq_y1_dc_ = 0;       // TODO(skal): dq-lum
  enc->dq_y2_dc_ = 0;
  enc->dq_y2_ac_ = 0;
  enc->dq_uv_dc_ = dq_uv_dc;
  enc->dq_uv_ac_ = dq_uv_ac;

  SetupFilterStrength(enc);   // initialize segments' filtering, eventually

  if (num_segments > 1) SimplifySegments(enc);

  SetupMatrices(enc);         // finalize quantization matrices
}